

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

Dimensions ftxui::Terminal::Size(void)

{
  int iVar1;
  winsize *pwVar2;
  short local_18;
  ushort local_16;
  int status;
  winsize w;
  
  memset(&local_18,0,8);
  iVar1 = ioctl(1,0x5413,&local_18);
  if (((local_16 == 0) || (local_18 == 0)) || (iVar1 < 0)) {
    pwVar2 = (winsize *)anon_unknown_0::FallbackSize();
    w = *pwVar2;
  }
  else {
    w.ws_col = 0;
    w.ws_row = local_16;
    w.ws_xpixel = local_18;
    w.ws_ypixel = 0;
  }
  return (Dimensions)w;
}

Assistant:

Dimensions Size() {
#if defined(__EMSCRIPTEN__)
  // This dimension was chosen arbitrarily to be able to display:
  // https://arthursonzogni.com/FTXUI/examples
  // This will have to be improved when someone has time to implement and need
  // it.
  return FallbackSize();
#elif defined(_WIN32)
  CONSOLE_SCREEN_BUFFER_INFO csbi;

  if (GetConsoleScreenBufferInfo(GetStdHandle(STD_OUTPUT_HANDLE), &csbi)) {
    return Dimensions{csbi.srWindow.Right - csbi.srWindow.Left + 1,
                      csbi.srWindow.Bottom - csbi.srWindow.Top + 1};
  }

  return FallbackSize();
#else
  winsize w{};
  const int status = ioctl(STDOUT_FILENO, TIOCGWINSZ, &w);  // NOLINT
  // The ioctl return value result should be checked. Some operating systems
  // don't support TIOCGWINSZ.
  if (w.ws_col == 0 || w.ws_row == 0 || status < 0) {
    return FallbackSize();
  }
  return Dimensions{w.ws_col, w.ws_row};
#endif
}